

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O2

uint32_t absl::lts_20250127::hash_internal::Mur(uint32_t a,uint32_t h)

{
  uint uVar1;
  
  uVar1 = (a * 0x16a88000 | a * -0x3361d2af >> 0x11) * 0x1b873593 ^ h;
  return (uVar1 << 0xd | uVar1 >> 0x13) * 5 + 0xe6546b64;
}

Assistant:

static uint32_t Mur(uint32_t a, uint32_t h) {
  // Helper from Murmur3 for combining two 32-bit values.
  a *= c1;
  a = Rotate32(a, 17);
  a *= c2;
  h ^= a;
  h = Rotate32(h, 19);
  return h * 5 + 0xe6546b64;
}